

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtContext.cpp
# Opt level: O2

void __thiscall JsrtContext::Unlink(JsrtContext *this)

{
  JsrtRuntime *pJVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type pJVar5;
  ulong uVar6;
  
  uVar6 = (ulong)(this->previous).ptr & 0xfffffffffffffffc;
  if (uVar6 == 0) {
    pJVar1 = (this->runtime).ptr;
    pJVar5 = (this->next).ptr;
    if (pJVar1->contextList == this) {
      pJVar1->contextList = (JsrtContext *)((ulong)pJVar5 & 0xfffffffffffffffc);
    }
  }
  else {
    if ((JsrtContext *)(*(ulong *)(uVar6 + 0x28) & 0xfffffffffffffffc) != this) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtContext.cpp"
                         ,0x36,"(this->previous->next == this)","this->previous->next == this");
      if (!bVar3) goto LAB_003a53ae;
      *puVar4 = 0;
      uVar6 = (ulong)(this->previous).ptr & 0xfffffffffffffffc;
    }
    pJVar5 = (this->next).ptr;
    *(Type *)(uVar6 + 0x28) = pJVar5;
  }
  uVar6 = (ulong)pJVar5 & 0xfffffffffffffffc;
  if (uVar6 != 0) {
    if ((JsrtContext *)(*(ulong *)(uVar6 + 0x20) & 0xfffffffffffffffc) != this) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtContext.cpp"
                         ,0x3c,"(this->next->previous == this)","this->next->previous == this");
      if (!bVar3) {
LAB_003a53ae:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
      uVar6 = (ulong)(this->next).ptr & 0xfffffffffffffffc;
    }
    *(Type *)(uVar6 + 0x20) = (this->previous).ptr;
  }
  return;
}

Assistant:

void JsrtContext::Unlink()
{
    // Unlink from JsrtRuntime JsrtContext list
    if (this->previous == nullptr)
    {
        // Have to check this because if we failed while creating, it might
        // never have gotten linked in to the runtime at all.
        if (this->runtime->contextList == this)
        {
            this->runtime->contextList = this->next;
        }
    }
    else
    {
        Assert(this->previous->next == this);
        this->previous->next = this->next;
    }

    if (this->next != nullptr)
    {
        Assert(this->next->previous == this);
        this->next->previous = this->previous;
    }
}